

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw_image.cxx
# Opt level: O2

void fl_rectf(int x,int y,int w,int h,uchar r,uchar g,uchar b)

{
  uchar c [3];
  uchar local_2b;
  uchar local_2a;
  uchar local_29;
  
  if (0x10 < fl_visual->depth) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x12])(fl_graphics_driver,r,g,(ulong)b);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)(uint)x,(ulong)(uint)y,(ulong)(uint)w,(ulong)(uint)h);
    return;
  }
  local_29 = b;
  local_2b = r;
  local_2a = g;
  innards(&local_2b,x,y,w,h,0,0,0,(Fl_Draw_Image_Cb)0x0,(void *)0x0,false);
  return;
}

Assistant:

void fl_rectf(int x, int y, int w, int h, uchar r, uchar g, uchar b) {
  if (fl_visual->depth > 16) {
    fl_color(r,g,b);
    fl_rectf(x,y,w,h);
  } else {
    uchar c[3];
    c[0] = r; c[1] = g; c[2] = b;
    innards(c,x,y,w,h,0,0,0,0,0,0);
  }
}